

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

sunrealtype N_VWL2Norm_Serial(N_Vector x,N_Vector w)

{
  long lVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = *x->content;
  sVar3 = 0.0;
  dVar4 = 0.0;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      dVar5 = *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
              *(double *)(*(long *)((long)w->content + 0x10) + lVar2 * 8);
      dVar4 = dVar4 + dVar5 * dVar5;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  if (0.0 < dVar4) {
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      return dVar4;
    }
    sVar3 = SQRT(dVar4);
  }
  return sVar3;
}

Assistant:

sunrealtype N_VWL2Norm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  sunrealtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++)
  {
    prodi = xd[i] * wd[i];
    sum += SUNSQR(prodi);
  }

  return (SUNRsqrt(sum));
}